

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

wstring * __thiscall
PDA::Transducer::Generator::add_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,int source,Register *dest,wchar_t suff)

{
  undefined4 in_register_00000014;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  wstring local_40;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"add",(allocator<wchar_t> *)&local_60);
  if ((int)dest == 0) {
    registerSuffix((Register *)CONCAT44(in_register_00000014,source));
  }
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  std::__cxx11::to_wstring(&local_40,(int)this);
  std::operator+(&local_60,L'$',&local_40);
  std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  Register::toString_abi_cxx11_(&local_40,(Register *)CONCAT44(in_register_00000014,source));
  std::operator+(&local_60,L",\t",&local_40);
  std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  std::__cxx11::wstring::~wstring((wstring *)&local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::add(const int source, const Register &dest, const wchar_t suff)
{
    std::wstring result = L"add";
    result += suff == L'\0' ? registerSuffix(dest) : suff;
    result += L'\t';
    result += L'$' + std::to_wstring(source);
    result += L",\t" + dest.toString();
    return result;
}